

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

unique_ptr<Sock,_std::default_delete<Sock>_>
ConnectThroughProxy(Proxy *proxy,string *dest,uint16_t port,bool *proxy_connection_failed)

{
  long lVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  undefined6 in_register_00000012;
  undefined1 *in_R8;
  long in_FS_OFFSET;
  __atomic_base<int> local_a4;
  undefined1 local_a0 [8];
  string local_98;
  ProxyCredentials random_auth;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Proxy::Connect((Proxy *)local_a0);
  if (local_a0 == (undefined1  [8])0x0) {
    *in_R8 = 1;
    (proxy->proxy).super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
    goto LAB_00a9ccbb;
  }
  if (*(char *)((long)&dest[2]._M_string_length + 1) == '\x01') {
    random_auth.username._M_dataplus._M_p = (pointer)&random_auth.username.field_2;
    random_auth.username._M_string_length = 0;
    random_auth.username.field_2._M_local_buf[0] = '\0';
    random_auth.password._M_dataplus._M_p = (pointer)&random_auth.password.field_2;
    random_auth.password._M_string_length = 0;
    random_auth.password.field_2._M_local_buf[0] = '\0';
    LOCK();
    UNLOCK();
    local_a4 = ConnectThroughProxy::counter.super___atomic_base<int>._M_i;
    ConnectThroughProxy::counter.super___atomic_base<int>._M_i =
         (__atomic_base<int>)
         (__atomic_base<int>)(ConnectThroughProxy::counter.super___atomic_base<int>._M_i + 1)._M_i;
    tinyformat::format<int>((string *)(local_a0 + 8),"%i",&local_a4._M_i);
    __str = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&random_auth.password,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_a0 + 8));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&random_auth.username,__str);
    std::__cxx11::string::~string((string *)(local_a0 + 8));
    bVar2 = Socks5((string *)CONCAT62(in_register_00000012,port),(uint16_t)proxy_connection_failed,
                   &random_auth,(Sock *)local_a0);
    if (!bVar2) {
      (proxy->proxy).super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      ProxyCredentials::~ProxyCredentials(&random_auth);
LAB_00a9ccb2:
      (*((Sock *)local_a0)->_vptr_Sock[1])(local_a0);
      goto LAB_00a9ccbb;
    }
    ProxyCredentials::~ProxyCredentials(&random_auth);
  }
  else {
    bVar2 = Socks5((string *)CONCAT62(in_register_00000012,port),(uint16_t)proxy_connection_failed,
                   (ProxyCredentials *)0x0,(Sock *)local_a0);
    if (!bVar2) {
      (proxy->proxy).super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      goto LAB_00a9ccb2;
    }
  }
  (proxy->proxy).super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)local_a0;
LAB_00a9ccbb:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
           (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)proxy;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Sock> ConnectThroughProxy(const Proxy& proxy,
                                          const std::string& dest,
                                          uint16_t port,
                                          bool& proxy_connection_failed)
{
    // first connect to proxy server
    auto sock = proxy.Connect();
    if (!sock) {
        proxy_connection_failed = true;
        return {};
    }

    // do socks negotiation
    if (proxy.m_randomize_credentials) {
        ProxyCredentials random_auth;
        static std::atomic_int counter(0);
        random_auth.username = random_auth.password = strprintf("%i", counter++);
        if (!Socks5(dest, port, &random_auth, *sock)) {
            return {};
        }
    } else {
        if (!Socks5(dest, port, nullptr, *sock)) {
            return {};
        }
    }
    return sock;
}